

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void Server::signal_handler(int dunno)

{
  __pid_t __val;
  char *__name;
  __cxx11 local_70 [32];
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [36];
  int local_c;
  int dunno_local;
  
  local_c = dunno;
  if (dunno == 2) {
    __val = getpid();
    std::__cxx11::to_string(local_70,__val);
    std::operator+((char *)local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "/tmp/webed_");
    std::operator+(local_30,(char *)local_50);
    __name = (char *)std::__cxx11::string::c_str();
    unlink(__name);
    std::__cxx11::string::~string((string *)local_30);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)local_70);
    exit(0);
  }
  if (dunno == 10) {
    printf("Alive %d\t\tNew %d\t\tDelete %d\n",
           (ulong)(uint)(Client::client_new - Client::client_delete),(ulong)(uint)Client::client_new
           ,(ulong)(uint)Client::client_delete);
    return;
  }
  fprintf(_stderr,"%s:%d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",0xd0
         );
  fprintf(_stderr,"--> %s\n","-1");
  perror("info");
  exit(1);
}

Assistant:

void Server::signal_handler(int dunno) {
    switch (dunno) {
        case SIGUSR1:
            printf("Alive %d\t\tNew %d\t\tDelete %d\n", Client::client_new - Client::client_delete,
                   Client::client_new, Client::client_delete);
            break;
        case SIGINT:
            unlink(("/tmp/webed_" + std::to_string(getpid()) + ".sock").c_str());
            exit(0);
        default:
            IF_NEGATIVE_EXIT(-1);
    }
}